

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O2

void __thiscall StunMsg_ErrorResponse_Test::TestBody(StunMsg_ErrorResponse_Test *this)

{
  uint16_t uVar1;
  int iVar2;
  stun_attr_errcode *attr;
  char *pcVar3;
  stun_attr_unknown *attr_00;
  stun_attr_hdr *actual;
  char *in_R9;
  size_t i;
  size_t n;
  AssertHelper local_138;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_100;
  uint16_t unknown [3];
  unsigned_short *local_f0;
  uint8_t tsx_id [12];
  char reason_phrase [18];
  uint8_t expected_result [60];
  uint8_t buffer [60];
  
  builtin_strncpy(reason_phrase,"Unknown Attribute",0x12);
  expected_result[0x30] = '\0';
  expected_result[0x31] = '\n';
  expected_result[0x32] = '\0';
  expected_result[0x33] = '\x06';
  expected_result[0x34] = '\0';
  expected_result[0x35] = '\x1a';
  expected_result[0x36] = '\0';
  expected_result[0x37] = '\x1b';
  expected_result[0x38] = 0x80;
  expected_result[0x39] = ',';
  expected_result[0x3a] = '\0';
  expected_result[0x3b] = '\0';
  builtin_memcpy(expected_result + 0x20,"own Attribute",0xe);
  expected_result[0x2e] = '\0';
  expected_result[0x2f] = '\0';
  expected_result[0x10] = ')';
  expected_result[0x11] = 0xda;
  expected_result[0x12] = 'A';
  expected_result[0x13] = '.';
  expected_result[0x14] = '\0';
  expected_result[0x15] = '\t';
  expected_result[0x16] = '\0';
  expected_result[0x17] = '\x15';
  expected_result[0x18] = '\0';
  expected_result[0x19] = '\0';
  expected_result[0x1a] = '\x04';
  expected_result[0x1b] = '\x14';
  expected_result[0x1c] = 'U';
  expected_result[0x1d] = 'n';
  expected_result[0x1e] = 'k';
  expected_result[0x1f] = 'n';
  expected_result[0] = '\x01';
  expected_result[1] = '\x11';
  expected_result[2] = '\0';
  expected_result[3] = '(';
  expected_result[4] = '!';
  expected_result[5] = '\x12';
  expected_result[6] = 0xa4;
  expected_result[7] = 'B';
  expected_result[8] = 'x';
  expected_result[9] = 0xad;
  expected_result[10] = '4';
  expected_result[0xb] = '3';
  expected_result[0xc] = 0xc6;
  expected_result[0xd] = 0xad;
  expected_result[0xe] = 'r';
  expected_result[0xf] = 0xc0;
  tsx_id[0] = 'x';
  tsx_id[1] = 0xad;
  tsx_id[2] = '4';
  tsx_id[3] = '3';
  tsx_id[4] = 0xc6;
  tsx_id[5] = 0xad;
  tsx_id[6] = 'r';
  tsx_id[7] = 0xc0;
  tsx_id[8] = ')';
  tsx_id[9] = 0xda;
  tsx_id[10] = 'A';
  tsx_id[0xb] = '.';
  unknown[2] = 0x802c;
  unknown[0] = 0x1a;
  unknown[1] = 0x1b;
  gtest_ar_.success_ = true;
  gtest_ar_._1_7_ = 0;
  local_138.data_ = (AssertHelperData *)0x3c;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"sizeof(expected_result)","sizeof(buffer)",
             (unsigned_long *)&gtest_ar_,(unsigned_long *)&local_138);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x224,pcVar3);
    testing::internal::AssertHelper::operator=(&local_138,(Message *)&gtest_ar_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_._0_4_ = 1;
    iVar2 = stun_msg_verify((stun_msg_hdr *)expected_result,0x3c);
    local_138.data_._0_4_ = iVar2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1",
               "stun_msg_verify((stun_msg_hdr*)expected_result, sizeof(expected_result))",
               (int *)&gtest_ar_,(int *)&local_138);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                 ,0x226,pcVar3);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&gtest_ar_);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      stun_msg_hdr_init((stun_msg_hdr *)buffer,0x111,tsx_id);
      stun_attr_errcode_add((stun_msg_hdr *)buffer,0x1a4,reason_phrase,'\0');
      local_f0 = unknown;
      stun_attr_unknown_add((stun_msg_hdr *)buffer,local_f0,3,'\0');
      anon_unknown.dwarf_6ced::IsEqual
                ((anon_unknown_dwarf_6ced *)&gtest_ar_,expected_result,(stun_msg_hdr *)buffer,0x3c);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_138);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"IsEqual(expected_result, buffer, sizeof(expected_result))",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x22d,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_138);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        std::__cxx11::string::~string((string *)&gtest_ar);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_138);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      gtest_ar_._0_4_ = 0x111;
      uVar1 = stun_msg_type((stun_msg_hdr *)expected_result);
      local_138.data_._0_2_ = uVar1;
      testing::internal::CmpHelperEQ<stun_msg_type,unsigned_short>
                ((internal *)&gtest_ar,"STUN_BINDING_ERROR_RESPONSE","stun_msg_type(msg_hdr)",
                 (stun_msg_type *)&gtest_ar_,(unsigned_short *)&local_138);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_138,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x231,pcVar3);
        testing::internal::AssertHelper::operator=(&local_138,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_138);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0;
      local_138.data_ = (AssertHelperData *)stun_msg_len((stun_msg_hdr *)expected_result);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"sizeof(expected_result)","stun_msg_len(msg_hdr)",
                 (unsigned_long *)&gtest_ar_,(unsigned_long *)&local_138);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_138,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x232,pcVar3);
        testing::internal::AssertHelper::operator=(&local_138,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_138);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      attr = (stun_attr_errcode *)
             stun_msg_next_attr((stun_msg_hdr *)expected_result,(stun_attr_hdr *)0x0);
      gtest_ar_._0_4_ = 9;
      uVar1 = stun_attr_type((stun_attr_hdr *)attr);
      local_138.data_._0_2_ = uVar1;
      testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                ((internal *)&gtest_ar,"STUN_ATTR_ERROR_CODE","stun_attr_type(attr_hdr)",
                 (stun_attr_type *)&gtest_ar_,(unsigned_short *)&local_138);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_138,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x235,pcVar3);
        testing::internal::AssertHelper::operator=(&local_138,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_138);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar_._0_4_ = 0x1a4;
      iVar2 = stun_attr_errcode_status(attr);
      local_138.data_._0_4_ = iVar2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"420","stun_attr_errcode_status(attr_errcode)",
                 (int *)&gtest_ar_,(int *)&local_138);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_138,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x237,pcVar3);
        testing::internal::AssertHelper::operator=(&local_138,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_138);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0;
      local_138.data_ = (AssertHelperData *)stun_attr_errcode_reason_len(attr);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"sizeof(reason_phrase)-1",
                 "stun_attr_errcode_reason_len(attr_errcode)",(unsigned_long *)&gtest_ar_,
                 (unsigned_long *)&local_138);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_138,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x239,pcVar3);
        testing::internal::AssertHelper::operator=(&local_138,(Message *)&gtest_ar_);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        pcVar3 = stun_attr_errcode_reason(attr);
        anon_unknown.dwarf_6ced::IsEqual
                  ((anon_unknown_dwarf_6ced *)&gtest_ar_,reason_phrase,pcVar3,0x11);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_138);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)
                     "IsEqual(reason_phrase, stun_attr_errcode_reason(attr_errcode), sizeof(reason_phrase)-1)"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_100,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x23c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_138);
          testing::internal::AssertHelper::~AssertHelper(&local_100);
          std::__cxx11::string::~string((string *)&gtest_ar);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_138);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        attr_00 = (stun_attr_unknown *)
                  stun_msg_next_attr((stun_msg_hdr *)expected_result,(stun_attr_hdr *)attr);
        gtest_ar_._0_4_ = 10;
        uVar1 = stun_attr_type((stun_attr_hdr *)attr_00);
        local_138.data_._0_2_ = uVar1;
        testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                  ((internal *)&gtest_ar,"STUN_ATTR_UNKNOWN_ATTRIBUTES","stun_attr_type(attr_hdr)",
                   (stun_attr_type *)&gtest_ar_,(unsigned_short *)&local_138);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_138,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x23f,pcVar3);
          testing::internal::AssertHelper::operator=(&local_138,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper(&local_138);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        gtest_ar_.success_ = true;
        gtest_ar_._1_7_ = 0;
        local_138.data_ = (AssertHelperData *)stun_attr_unknown_count(attr_00);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar,"(sizeof(unknown)/sizeof(unknown[0]))",
                   "stun_attr_unknown_count(attr_unk)",(unsigned_long *)&gtest_ar_,
                   (unsigned_long *)&local_138);
        if (gtest_ar.success_ != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          for (n = 0; n != 3; n = n + 1) {
            uVar1 = stun_attr_unknown_get(attr_00,n);
            gtest_ar_._0_2_ = uVar1;
            testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                      ((internal *)&gtest_ar,"unknown[i]","stun_attr_unknown_get(attr_unk, i)",
                       local_f0,(unsigned_short *)&gtest_ar_);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_);
              pcVar3 = "";
              if (gtest_ar.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_138,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                         ,0x243,pcVar3);
              testing::internal::AssertHelper::operator=(&local_138,(Message *)&gtest_ar_);
              testing::internal::AssertHelper::~AssertHelper(&local_138);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar_);
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            local_f0 = local_f0 + 1;
          }
          actual = stun_msg_next_attr((stun_msg_hdr *)expected_result,(stun_attr_hdr *)attr_00);
          testing::internal::EqHelper<true>::Compare<_stun_attr_hdr_const>
                    ((EqHelper<true> *)&gtest_ar,"__null","attr_hdr",(Secret *)0x0,actual);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_138,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0x247,pcVar3);
            testing::internal::AssertHelper::operator=(&local_138,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper(&local_138);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar_);
          }
          goto LAB_00129875;
        }
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_138,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x241,pcVar3);
        testing::internal::AssertHelper::operator=(&local_138,(Message *)&gtest_ar_);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_138);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
LAB_00129875:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(StunMsg, ErrorResponse) {
  const char reason_phrase[] = "Unknown Attribute";
  const uint8_t expected_result[] = {
    0x01,0x11,0x00,0x28, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0x78,0xad,0x34,0x33, // }
    0xc6,0xad,0x72,0xc0, // }  Transaction ID
    0x29,0xda,0x41,0x2e, // }
    0x00,0x09,0x00,0x15, //    ERROR-CODE attribute header
    0x00,0x00,0x04,0x14, //    class = 4, code = 20 (420)
    0x55,0x6e,0x6b,0x6e, // }
    0x6f,0x77,0x6e,0x20, // }
    0x41,0x74,0x74,0x72, // }  Reason: Unknown Attribute
    0x69,0x62,0x75,0x74, // }
    0x65,0x00,0x00,0x00, // }
    0x00,0x0A,0x00,0x06, //    UNKNOWN-ATTRIBUTES attribute header
    0x00,0x1A,0x00,0x1B, //    0x001A, 0x001B
    0x80,0x2C,0x00,0x00, //    0x802C
  };

  uint8_t buffer[sizeof(stun_msg_hdr)
    + STUN_ATTR_ERROR_CODE_SIZE(sizeof(reason_phrase)-1)
    + STUN_ATTR_UNKNOWN_SIZE(3)];

  stun_msg_hdr *msg_hdr = (stun_msg_hdr *)buffer;
  uint8_t tsx_id[12] = {
    0x78,0xad,0x34,0x33,
    0xc6,0xad,0x72,0xc0,
    0x29,0xda,0x41,0x2e,
  };
  uint16_t unknown[] = { 0x001a, 0x001b, 0x802c };

  ASSERT_EQ(sizeof(expected_result), sizeof(buffer));
  ASSERT_EQ(1, stun_msg_verify((stun_msg_hdr*)expected_result,
      sizeof(expected_result)));

  stun_msg_hdr_init(msg_hdr, STUN_BINDING_ERROR_RESPONSE, tsx_id);
  stun_attr_errcode_add(msg_hdr, 420, reason_phrase, 0);
  stun_attr_unknown_add(msg_hdr, unknown, ARRAY_SIZE(unknown), 0);

  EXPECT_TRUE(IsEqual(expected_result, buffer,
      sizeof(expected_result)));

  // Now decoding
  msg_hdr = (stun_msg_hdr *)expected_result;
  EXPECT_EQ(STUN_BINDING_ERROR_RESPONSE, stun_msg_type(msg_hdr));
  EXPECT_EQ(sizeof(expected_result), stun_msg_len(msg_hdr));

  const stun_attr_hdr *attr_hdr = stun_msg_next_attr(msg_hdr, NULL);
  EXPECT_EQ(STUN_ATTR_ERROR_CODE, stun_attr_type(attr_hdr));
  stun_attr_errcode *attr_errcode = (stun_attr_errcode *)attr_hdr;
  EXPECT_EQ(420, stun_attr_errcode_status(attr_errcode));
  ASSERT_EQ(sizeof(reason_phrase)-1,
      stun_attr_errcode_reason_len(attr_errcode));
  EXPECT_TRUE(IsEqual(reason_phrase,
      stun_attr_errcode_reason(attr_errcode),
      sizeof(reason_phrase)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_UNKNOWN_ATTRIBUTES, stun_attr_type(attr_hdr));
  stun_attr_unknown *attr_unk = (stun_attr_unknown *)attr_hdr;
  ASSERT_EQ(ARRAY_SIZE(unknown), stun_attr_unknown_count(attr_unk));
  for (size_t i = 0; i < ARRAY_SIZE(unknown); i++) {
    EXPECT_EQ(unknown[i], stun_attr_unknown_get(attr_unk, i));
  }

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(NULL, attr_hdr);
}